

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::interval_t,duckdb::interval_t,duckdb::Equals,true,false,true,true>
                (interval_t *ldata,interval_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  int iVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  sel_t *psVar4;
  sel_t *psVar5;
  sel_t *psVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  int64_t *piVar13;
  ulong uVar14;
  sel_t sVar15;
  ulong uVar16;
  idx_t iVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  bool bVar21;
  interval_t *left;
  
  if (count + 0x3f < 0x40) {
    iVar17 = 0;
  }
  else {
    puVar2 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar17 = 0;
    lVar19 = 0;
    uVar10 = 0;
    uVar16 = 0;
    do {
      uVar14 = uVar10;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar18 = uVar10 + 0x40;
        if (count <= uVar10 + 0x40) {
          uVar18 = count;
        }
LAB_0145b06a:
        if (uVar10 < uVar18) {
          psVar4 = sel->sel_vector;
          iVar1 = ldata->months;
          iVar11 = ldata->days;
          lVar8 = ldata->micros;
          lVar7 = lVar8 / 86400000000 + (long)iVar11;
          psVar5 = true_sel->sel_vector;
          psVar6 = false_sel->sel_vector;
          piVar13 = &rdata[uVar10].micros;
          do {
            uVar14 = uVar10;
            if (psVar4 != (sel_t *)0x0) {
              uVar14 = (ulong)psVar4[uVar10];
            }
            lVar12 = *piVar13;
            if (iVar11 == *(int32_t *)((long)piVar13 + -4) &&
                iVar1 == ((interval_t *)(piVar13 + -1))->months) {
              bVar21 = true;
              lVar20 = (long)iVar11;
              if (lVar8 != lVar12) goto LAB_0145b16c;
            }
            else {
              lVar20 = (long)*(int32_t *)((long)piVar13 + -4);
LAB_0145b16c:
              lVar20 = lVar20 + lVar12 / 86400000000;
              bVar21 = false;
              if ((lVar7 / 0x1e + (long)iVar1 ==
                   (long)((interval_t *)(piVar13 + -1))->months + lVar20 / 0x1e) &&
                 (bVar21 = false, lVar7 % 0x1e == lVar20 % 0x1e)) {
                bVar21 = lVar8 % 86400000000 == lVar12 % 86400000000;
              }
            }
            psVar5[iVar17] = (sel_t)uVar14;
            iVar17 = iVar17 + bVar21;
            psVar6[lVar19] = (sel_t)uVar14;
            lVar19 = (ulong)(bVar21 ^ 1) + lVar19;
            uVar10 = uVar10 + 1;
            piVar13 = piVar13 + 2;
            uVar14 = uVar18;
          } while (uVar18 != uVar10);
        }
      }
      else {
        uVar3 = puVar2[uVar16];
        uVar18 = uVar10 + 0x40;
        if (count <= uVar10 + 0x40) {
          uVar18 = count;
        }
        if (uVar3 == 0xffffffffffffffff) goto LAB_0145b06a;
        if (uVar3 == 0) {
          uVar14 = uVar18;
          if (uVar10 < uVar18) {
            psVar4 = sel->sel_vector;
            psVar5 = false_sel->sel_vector;
            do {
              sVar15 = (sel_t)uVar10;
              if (psVar4 != (sel_t *)0x0) {
                sVar15 = psVar4[uVar10];
              }
              psVar5[lVar19] = sVar15;
              lVar19 = lVar19 + 1;
              uVar10 = uVar10 + 1;
            } while (uVar18 != uVar10);
          }
        }
        else if (uVar10 < uVar18) {
          psVar4 = sel->sel_vector;
          psVar5 = true_sel->sel_vector;
          psVar6 = false_sel->sel_vector;
          piVar13 = &rdata[uVar10].micros;
          uVar9 = 0;
          do {
            if (psVar4 == (sel_t *)0x0) {
              sVar15 = (int)uVar10 + (int)uVar9;
            }
            else {
              sVar15 = psVar4[uVar10 + uVar9];
            }
            if ((uVar3 >> (uVar9 & 0x3f) & 1) == 0) {
              bVar21 = false;
            }
            else {
              iVar1 = ldata->days;
              lVar7 = ldata->micros;
              lVar8 = *piVar13;
              iVar11 = *(int32_t *)((long)piVar13 + -4);
              if ((*(int32_t *)((long)piVar13 + -4) != iVar1 ||
                   ((interval_t *)(piVar13 + -1))->months != ldata->months) ||
                 (iVar11 = iVar1, bVar21 = true, lVar7 != lVar8)) {
                lVar20 = (long)iVar1 + lVar7 / 86400000000;
                lVar12 = (long)iVar11 + lVar8 / 86400000000;
                bVar21 = false;
                if (((long)ldata->months + lVar20 / 0x1e ==
                     (long)((interval_t *)(piVar13 + -1))->months + lVar12 / 0x1e) &&
                   (bVar21 = false, lVar20 % 0x1e == lVar12 % 0x1e)) {
                  bVar21 = lVar7 % 86400000000 == lVar8 % 86400000000;
                }
              }
            }
            psVar5[iVar17] = sVar15;
            iVar17 = iVar17 + bVar21;
            psVar6[lVar19] = sVar15;
            lVar19 = (ulong)(bVar21 ^ 1) + lVar19;
            uVar9 = uVar9 + 1;
            piVar13 = piVar13 + 2;
            uVar14 = uVar18;
          } while (uVar18 - uVar10 != uVar9);
        }
      }
      uVar10 = uVar14;
      uVar16 = uVar16 + 1;
    } while (uVar16 != count + 0x3f >> 6);
  }
  return iVar17;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}